

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O1

bool CaDiCaL::parse_int_str(char *val_str,int *val)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  uint uVar5;
  uint uVar6;
  byte bVar7;
  long lVar8;
  byte *pbVar9;
  
  iVar2 = strcmp(val_str,"true");
  if (iVar2 == 0) {
    iVar2 = 1;
  }
  else {
    iVar2 = strcmp(val_str,"false");
    if (iVar2 == 0) {
      iVar2 = 0;
    }
    else {
      uVar3 = (ulong)(*val_str == '-');
      if (9 < (int)val_str[uVar3] - 0x30U) {
        return false;
      }
      uVar4 = (ulong)((int)val_str[uVar3] - 0x30U);
      bVar7 = val_str[uVar3 + 1];
      pbVar9 = (byte *)(val_str + uVar3 + 2);
      while (uVar5 = (int)(char)bVar7 - 0x30, uVar5 < 10) {
        lVar8 = uVar4 * 10;
        if (0xccccccc < (long)uVar4) {
          lVar8 = 0x80000000;
        }
        uVar4 = (ulong)uVar5 + lVar8;
        if ((long)(0x80000000 - (ulong)uVar5) < lVar8) {
          uVar4 = 0x80000000;
        }
        bVar7 = *pbVar9;
        pbVar9 = pbVar9 + 1;
      }
      uVar5 = (uint)bVar7;
      if (bVar7 != 0) {
        if (uVar5 != 0x65) {
          return false;
        }
        bVar7 = *pbVar9;
        if ((int)(char)bVar7 - 0x30U < 10) {
          uVar6 = 0;
          uVar1 = (int)(char)bVar7 - 0x30U;
          do {
            uVar5 = uVar1;
            pbVar9 = pbVar9 + 1;
            if (uVar6 != 0) {
              uVar5 = 10;
            }
            bVar7 = *pbVar9;
            uVar6 = uVar5;
            uVar1 = (int)(char)bVar7 - 0x30U;
          } while ((int)(char)bVar7 - 0x30U < 10);
        }
        else {
          uVar5 = 0;
        }
        if (bVar7 != 0) {
          return false;
        }
      }
      if (0 < (int)uVar5) {
        do {
          uVar4 = uVar4 * 10;
          uVar5 = uVar5 - 1;
        } while (uVar5 != 0);
      }
      if (*val_str == '-') {
        lVar8 = -0x80000000;
        if (-0x80000000 < (long)-uVar4) {
          lVar8 = -uVar4;
        }
        iVar2 = (int)lVar8;
      }
      else {
        uVar3 = 0x7fffffff;
        if ((long)uVar4 < 0x7fffffff) {
          uVar3 = uVar4;
        }
        iVar2 = (int)uVar3;
      }
    }
  }
  *val = iVar2;
  return true;
}

Assistant:

bool parse_int_str (const char *val_str, int &val) {
  if (!strcmp (val_str, "true"))
    val = 1;
  else if (!strcmp (val_str, "false"))
    val = 0;
  else {
    const char *p = val_str;
    int sign;

    if (*p == '-')
      sign = -1, p++;
    else
      sign = 1;

    int ch;
    if (!isdigit ((ch = *p++)))
      return false;

    const int64_t bound = -(int64_t) INT_MIN;
    int64_t mantissa = ch - '0';

    while (isdigit (ch = *p++)) {
      if (bound / 10 < mantissa)
        mantissa = bound;
      else
        mantissa *= 10;
      const int digit = ch - '0';
      if (bound - digit < mantissa)
        mantissa = bound;
      else
        mantissa += digit;
    }

    int exponent = 0;
    if (ch == 'e') {
      while (isdigit ((ch = *p++)))
        exponent = exponent ? 10 : ch - '0';
      if (ch)
        return false;
    } else if (ch)
      return false;

    assert (exponent <= 10);
    int64_t val64 = mantissa;
    for (int i = 0; i < exponent; i++)
      val64 *= 10;

    if (sign < 0) {
      val64 = -val64;
      if (val64 < INT_MIN)
        val64 = INT_MIN;
    } else {
      if (val64 > INT_MAX)
        val64 = INT_MAX;
    }

    assert (INT_MIN <= val64);
    assert (val64 <= INT_MAX);

    val = val64;
  }
  return true;
}